

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonWriter.cpp
# Opt level: O3

JsonWriter * __thiscall Corrade::Utility::JsonWriter::beginObject(JsonWriter *this)

{
  size_t count;
  State *pSVar1;
  char *pcVar2;
  Pair<unsigned_long,_unsigned_long> *pPVar3;
  char *pcVar4;
  ostream *poVar5;
  Debug *this_00;
  ulong uVar6;
  ulong uVar7;
  char *__src;
  ulong uVar8;
  size_t valueCount;
  char local_61;
  char *local_60;
  Error local_58;
  
  pSVar1 = Containers::Pointer<Corrade::Utility::JsonWriter::State>::operator*(&this->_state);
  if ((pSVar1->expecting < CompactArrayValueOrArrayEnd) || (pSVar1->expecting == ObjectValue)) {
    writeCommaNewlineIndentInternal(this);
    local_61 = '{';
    pcVar2 = (pSVar1->out)._data;
    if ((pSVar1->out)._deleter == Containers::ArrayMallocAllocator<char>::deleter) {
      pcVar4 = (char *)(*(long *)(pcVar2 + -8) - 8);
    }
    else {
      pcVar4 = (char *)(pSVar1->out)._size;
    }
    if (pcVar4 <= &local_61 + -(long)pcVar2) {
      pcVar2 = Containers::Implementation::
               arrayGrowBy<char,Corrade::Containers::ArrayMallocAllocator<char>>(&pSVar1->out,1);
      *pcVar2 = local_61;
      pPVar3 = Containers::
               Array<Corrade::Containers::Pair<unsigned_long,_unsigned_long>,_void_(*)(Corrade::Containers::Pair<unsigned_long,_unsigned_long>_*,_unsigned_long)>
               ::back(&pSVar1->levels);
      uVar8 = (pSVar1->indentation)._size + pPVar3->_first;
      pPVar3 = Containers::Implementation::
               arrayGrowBy<Corrade::Containers::Pair<unsigned_long,unsigned_long>,Corrade::Containers::ArrayMallocAllocator<Corrade::Containers::Pair<unsigned_long,unsigned_long>>>
                         (&pSVar1->levels,1);
      pPVar3->_first = uVar8;
      pPVar3->_second = 0xffffffffffffffff;
      uVar7 = (pSVar1->whitespace)._size;
      if (uVar7 < uVar8) {
        count = (pSVar1->indentation)._size;
        local_60 = (pSVar1->whitespace)._data;
        if ((pSVar1->whitespace)._deleter == Containers::ArrayMallocAllocator<char>::deleter) {
          uVar7 = *(long *)(local_60 + -8) - 8;
        }
        pcVar2 = (pSVar1->indentation)._data;
        pcVar4 = Containers::Implementation::
                 arrayGrowBy<char,Corrade::Containers::ArrayMallocAllocator<char>>
                           (&pSVar1->whitespace,count);
        if (count != 0) {
          uVar6 = (long)pcVar2 - (long)local_60;
          uVar8 = 0xffffffffffffffff;
          if (uVar6 < uVar7) {
            uVar8 = uVar6;
          }
          __src = (pSVar1->whitespace)._data + uVar8;
          if (uVar7 <= uVar6) {
            __src = pcVar2;
          }
          memcpy(pcVar4,__src,count);
        }
      }
      pSVar1->expecting = ObjectKeyOrEnd;
      pSVar1->needsCommaBefore = false;
      return this;
    }
    poVar5 = Error::defaultOutput();
    Error::Error(&local_58,poVar5,(Flags)0x0);
    Debug::operator<<(&local_58.super_Debug,
                      "Containers::arrayAppend(): use the list variant to append values from within the array itself"
                     );
  }
  else {
    poVar5 = Error::defaultOutput();
    Error::Error(&local_58,poVar5,(Flags)0x0);
    this_00 = Debug::operator<<(&local_58.super_Debug,"Utility::JsonWriter::beginObject(): expected"
                               );
    Debug::operator<<(this_00,*(char **)((anonymous_namespace)::ExpectingString +
                                        (long)(int)pSVar1->expecting * 8));
  }
  Error::~Error(&local_58);
  abort();
}

Assistant:

JsonWriter& JsonWriter::beginObject() {
    State& state = *_state;
    CORRADE_ASSERT(
        state.expecting == Expecting::Value ||
        state.expecting == Expecting::ObjectValue ||
        state.expecting == Expecting::ArrayValueOrArrayEnd,
        "Utility::JsonWriter::beginObject(): expected" << ExpectingString[int(state.expecting)], *this);

    /* Comma, newline and indent, object opening brace */
    writeCommaNewlineIndentInternal();
    arrayAppend(state.out, '{');

    /* Indent next level further; mark this as an object */
    if(arrayAppend(state.levels, InPlaceInit, state.levels.back().first() + state.indentation.size(), ~std::size_t{}).first() > state.whitespace.size())
        arrayAppend(state.whitespace, state.indentation);

    /* Next expectig an object key or end */
    state.expecting = Expecting::ObjectKeyOrEnd;
    state.needsCommaBefore = false;

    return *this;
}